

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall leveldb::Compaction::IsBaseLevelForKey(Compaction *this,Slice *user_key)

{
  ulong uVar1;
  int iVar2;
  Comparator *pCVar3;
  size_type sVar4;
  InternalKey *in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  FileMetaData *f;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  int lvl;
  Comparator *user_cmp;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  Comparator *in_stack_ffffffffffffff70;
  InternalKey *in_stack_ffffffffffffff78;
  int local_4c;
  bool local_29;
  Slice local_28;
  Slice local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = InternalKeyComparator::user_comparator
                     ((InternalKeyComparator *)
                      CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  local_4c = *in_RDI + 2;
  do {
    if (6 < local_4c) {
      local_29 = true;
LAB_018b373d:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_29;
    }
    while (uVar1 = *(ulong *)(in_RDI + (long)local_4c * 2 + 0x48),
          sVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  size((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)), uVar1 < sVar4
          ) {
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator[]
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 in_stack_ffffffffffffff78,(size_type)in_stack_ffffffffffffff70);
      local_18 = InternalKey::user_key(in_stack_ffffffffffffff78);
      iVar2 = (*pCVar3->_vptr_Comparator[2])(pCVar3,in_RSI,&local_18);
      if (iVar2 < 1) {
        in_stack_ffffffffffffff70 = pCVar3;
        in_stack_ffffffffffffff78 = in_RSI;
        local_28 = InternalKey::user_key(in_RSI);
        iVar2 = (*in_stack_ffffffffffffff70->_vptr_Comparator[2])
                          (in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,&local_28);
        if (-1 < iVar2) {
          local_29 = false;
          goto LAB_018b373d;
        }
        break;
      }
      *(long *)(in_RDI + (long)local_4c * 2 + 0x48) =
           *(long *)(in_RDI + (long)local_4c * 2 + 0x48) + 1;
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

bool Compaction::IsBaseLevelForKey(const Slice& user_key) {
  // Maybe use binary search to find right entry instead of linear search?
  const Comparator* user_cmp = input_version_->vset_->icmp_.user_comparator();
  for (int lvl = level_ + 2; lvl < config::kNumLevels; lvl++) {
    const std::vector<FileMetaData*>& files = input_version_->files_[lvl];
    while (level_ptrs_[lvl] < files.size()) {
      FileMetaData* f = files[level_ptrs_[lvl]];
      if (user_cmp->Compare(user_key, f->largest.user_key()) <= 0) {
        // We've advanced far enough
        if (user_cmp->Compare(user_key, f->smallest.user_key()) >= 0) {
          // Key falls in this file's range, so definitely not base level
          return false;
        }
        break;
      }
      level_ptrs_[lvl]++;
    }
  }
  return true;
}